

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc.cpp
# Opt level: O0

int BoxMuller(double *p,double *q)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double s;
  double r;
  double pi;
  double *q_local;
  double *p_local;
  
  dVar3 = asin(1.0);
  iVar1 = rand();
  iVar2 = rand();
  dVar4 = log((double)iVar1 / 2147483647.0);
  dVar4 = sqrt(dVar4 * -2.0);
  dVar5 = sin(dVar3 * 2.0 * 2.0 * ((double)iVar2 / 2147483647.0));
  *p = dVar4 * dVar5;
  dVar4 = log((double)iVar1 / 2147483647.0);
  dVar4 = sqrt(dVar4 * -2.0);
  dVar3 = cos(dVar3 * 2.0 * 2.0 * ((double)iVar2 / 2147483647.0));
  *q = dVar4 * dVar3;
  return 0;
}

Assistant:

int BoxMuller(double &p, double &q) {
    double pi = 2e0 * asin(1e0);
    double r = (double) rand() / RAND_MAX;
    double s = (double) rand() / RAND_MAX;

    p = sqrt(-2e0 * log(r)) * sin(2e0 * pi * s);
    q = sqrt(-2e0 * log(r)) * cos(2e0 * pi * s);

    return 0;
}